

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Flow.c
# Opt level: O2

void Llb_ManFlowPrepareCut(Aig_Man_t *p,Vec_Ptr_t *vLower,Vec_Ptr_t *vUpper)

{
  undefined1 *puVar1;
  void *pvVar2;
  Aig_Obj_t *pAVar3;
  int iVar4;
  
  for (iVar4 = 0; iVar4 < p->vObjs->nSize; iVar4 = iVar4 + 1) {
    pvVar2 = Vec_PtrEntry(p->vObjs,iVar4);
    if (pvVar2 != (void *)0x0) {
      *(ulong *)((long)pvVar2 + 0x18) = *(ulong *)((long)pvVar2 + 0x18) & 0xffffffffffffffcf | 0x20;
    }
  }
  puVar1 = &p->pConst1->field_0x18;
  *(ulong *)puVar1 = *(ulong *)puVar1 & 0xffffffffffffffdf;
  for (iVar4 = 0; iVar4 < p->vCis->nSize; iVar4 = iVar4 + 1) {
    pvVar2 = Vec_PtrEntry(p->vCis,iVar4);
    *(byte *)((long)pvVar2 + 0x18) = *(byte *)((long)pvVar2 + 0x18) & 0xdf;
  }
  for (iVar4 = 0; iVar4 < vUpper->nSize; iVar4 = iVar4 + 1) {
    pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(vUpper,iVar4);
    Llb_ManFlowCleanMarkB_rec(pAVar3);
  }
  iVar4 = 0;
  while( true ) {
    if (vLower->nSize <= iVar4) {
      return;
    }
    pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(vLower,iVar4);
    if ((pAVar3->field_0x18 & 0x20) != 0) break;
    Llb_ManFlowSetMarkA_rec(pAVar3);
    iVar4 = iVar4 + 1;
  }
  __assert_fail("pObj->fMarkB == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/llb/llb2Flow.c"
                ,0x3d3,"void Llb_ManFlowPrepareCut(Aig_Man_t *, Vec_Ptr_t *, Vec_Ptr_t *)");
}

Assistant:

void Llb_ManFlowPrepareCut( Aig_Man_t * p, Vec_Ptr_t * vLower, Vec_Ptr_t * vUpper )
{
    Aig_Obj_t * pObj;
    int i;
    // reset marks
    Aig_ManForEachObj( p, pObj, i )
    {
        pObj->fMarkA = 0;
        pObj->fMarkB = 1;
    }
    // clean PIs and const
    Aig_ManConst1(p)->fMarkB = 0;
    Aig_ManForEachCi( p, pObj, i )
        pObj->fMarkB = 0;
    // clean upper cut
//printf( "Upper: ");
    Vec_PtrForEachEntry( Aig_Obj_t *, vUpper, pObj, i )
    {
        Llb_ManFlowCleanMarkB_rec( pObj );
//printf( "%d ", pObj->Id );
    }
//printf( "\n" );
    // set lower cut
//printf( "Lower: ");
    Vec_PtrForEachEntry( Aig_Obj_t *, vLower, pObj, i )
    {
//printf( "%d ", pObj->Id );
        assert( pObj->fMarkB == 0 );
        Llb_ManFlowSetMarkA_rec( pObj );
    }
//printf( "\n" );
}